

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

void __thiscall FScanner::PrepareScript(FScanner *this)

{
  FString *this_00;
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  
  this_00 = &this->ScriptBuffer;
  pcVar2 = (this->ScriptBuffer).Chars;
  uVar3 = (ulong)*(uint *)(pcVar2 + -0xc);
  if (uVar3 != 0) {
    cVar1 = pcVar2[uVar3 - 1];
    if (cVar1 == '\n') goto LAB_004800d9;
    if (cVar1 == '\0') {
      pcVar2 = FString::LockBuffer(this_00);
      pcVar2[(ulong)*(uint *)(this_00->Chars + -0xc) - 1] = '\n';
      FString::UnlockBuffer(this_00);
      goto LAB_004800d9;
    }
  }
  FString::operator+=(this_00,'\n');
LAB_004800d9:
  pcVar2 = (this->ScriptBuffer).Chars;
  this->ScriptPtr = pcVar2;
  this->ScriptEndPtr = pcVar2 + *(uint *)(pcVar2 + -0xc);
  this->Line = 1;
  this->End = false;
  this->ScriptOpen = true;
  this->String = this->StringBuffer;
  this->AlreadyGot = false;
  this->LastGotToken = false;
  this->LastGotPtr = (char *)0x0;
  this->LastGotLine = 1;
  this->CMode = false;
  this->StateMode = '\0';
  this->StateOptions = false;
  this->Escape = true;
  this->StringBuffer[0] = '\0';
  FString::operator=(&this->BigStringBuffer,(char *)"");
  return;
}

Assistant:

void FScanner::PrepareScript ()
{
	// The scanner requires the file to end with a '\n', so add one if
	// it doesn't already.
	if (ScriptBuffer.Len() == 0 || ScriptBuffer[ScriptBuffer.Len() - 1] != '\n')
	{
		// If the last character in the buffer is a null character, change
		// it to a newline. Otherwise, append a newline to the end.
		if (ScriptBuffer.Len() > 0 && ScriptBuffer[ScriptBuffer.Len() - 1] == '\0')
		{
			ScriptBuffer.LockBuffer()[ScriptBuffer.Len() - 1] = '\n';
			ScriptBuffer.UnlockBuffer();
		}
		else
		{
			ScriptBuffer += '\n';
		}
	}

	ScriptPtr = &ScriptBuffer[0];
	ScriptEndPtr = &ScriptBuffer[ScriptBuffer.Len()];
	Line = 1;
	End = false;
	ScriptOpen = true;
	String = StringBuffer;
	AlreadyGot = false;
	LastGotToken = false;
	LastGotPtr = NULL;
	LastGotLine = 1;
	CMode = false;
	Escape = true;
	StateMode = 0;
	StateOptions = false;
	StringBuffer[0] = '\0';
	BigStringBuffer = "";
}